

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O3

uc_err uc_ctl(uc_engine *uc,uc_control_type control,...)

{
  uint64_t uVar1;
  uc_tb *puVar2;
  char in_AL;
  gint gVar3;
  uc_err uVar4;
  uint64_t *key;
  byte bVar5;
  int iVar6;
  uc_arch uVar7;
  uc_tb *in_RCX;
  uc_tb *in_RDX;
  uint uVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  uc_tb *puVar9;
  uc_tb *puVar10;
  bool bVar11;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  uc_ctl_exit_request req;
  uc_tb *local_f8;
  undefined8 local_f0;
  uc_tb *local_d8;
  uc_tb *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  uVar4 = UC_ERR_ARG;
  if (0xe < (ushort)control) {
    return UC_ERR_ARG;
  }
  uVar8 = control >> 0x1e;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  switch(control & 0xffff) {
  case UC_CTL_UC_MODE:
    if (uVar8 != 2) {
      return UC_ERR_ARG;
    }
    uVar7 = uc->mode;
    goto LAB_004cdfdc;
  case UC_CTL_UC_PAGE_SIZE:
    if (uVar8 == 2) {
      if ((uc->init_done == false) &&
         (local_d8 = in_RDX, uVar4 = uc_init_engine(uc), uVar4 != UC_ERR_OK)) {
        return uVar4;
      }
      uVar7 = uc->target_page_size;
      goto LAB_004cdfdc;
    }
    if (uc->init_done != false) {
      return UC_ERR_ARG;
    }
    if (uc->arch != UC_ARCH_ARM) {
      return UC_ERR_ARG;
    }
    uVar8 = (uc_context_content)local_d8 - ((uc_context_content)local_d8 >> 1 & 0x55555555);
    uVar8 = (uVar8 >> 2 & 0x33333333) + (uVar8 & 0x33333333);
    if (1 < ((uVar8 >> 4) + uVar8 & 0xf0f0f0f) * 0x1010101 >> 0x18) {
      return UC_ERR_ARG;
    }
    uVar8 = 0x1f;
    if ((uc_context_content)local_d8 != 0) {
      for (; (uc_context_content)local_d8 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    iVar6 = (uVar8 ^ 0xffffffe0) + 0x21;
    if ((uc_context_content)local_d8 == 0) {
      iVar6 = 0;
    }
    uc->target_bits = iVar6;
    break;
  case UC_CTL_UC_ARCH:
    if (uVar8 != 2) {
      return UC_ERR_ARG;
    }
    uVar7 = uc->arch;
LAB_004cdfdc:
    *(uc_arch *)&local_d8->pc = uVar7;
    break;
  case UC_CTL_UC_TIMEOUT:
    if (uVar8 != 2) {
      return UC_ERR_ARG;
    }
    local_d8->pc = uc->timeout;
    break;
  case UC_CTL_UC_USE_EXITS:
    if (uVar8 != 1) {
      return UC_ERR_ARG;
    }
    uc->use_exits = (uc_context_content)local_d8;
    break;
  case UC_CTL_UC_EXITS_CNT:
    local_d8 = in_RDX;
    if ((uc->init_done == false) && (uVar4 = uc_init_engine(uc), uVar4 != UC_ERR_OK)) {
      return uVar4;
    }
    puVar10 = local_d8;
    if (uVar8 != 2) {
      return UC_ERR_ARG;
    }
    if (uc->use_exits == 0) {
      return UC_ERR_ARG;
    }
    gVar3 = g_tree_nnodes(uc->ctl_exits);
    puVar10->pc = (long)gVar3;
    break;
  case UC_CTL_UC_EXITS:
    local_d8 = in_RDX;
    if ((uc->init_done == false) && (uVar4 = uc_init_engine(uc), uVar4 != UC_ERR_OK)) {
      return uVar4;
    }
    puVar2 = local_d0;
    puVar10 = local_d8;
    if (uc->use_exits == 0) {
      return UC_ERR_ARG;
    }
    if (uVar8 == 1) {
      g_tree_remove_all(uc->ctl_exits);
      if (puVar2 != (uc_tb *)0x0) {
        puVar9 = (uc_tb *)0x0;
        do {
          uVar1 = (&puVar10->pc)[(long)puVar9];
          key = (uint64_t *)g_malloc(8);
          *key = uVar1;
          g_tree_insert(uc->ctl_exits,key,&DAT_00000001);
          puVar9 = (uc_tb *)((long)&puVar9->pc + 1);
        } while (puVar2 != puVar9);
        return UC_ERR_OK;
      }
    }
    else {
      if (uVar8 != 2) {
        return UC_ERR_ARG;
      }
      gVar3 = g_tree_nnodes(uc->ctl_exits);
      if (puVar2 < (uc_tb *)(long)gVar3) {
        return UC_ERR_ARG;
      }
      local_f0 = 0;
      local_f8 = puVar10;
      g_tree_foreach(uc->ctl_exits,uc_read_exit_iter,&local_f8);
    }
    break;
  case UC_CTL_CPU_MODEL:
    if (uVar8 == 2) {
      if ((uc->init_done == false) &&
         (local_d8 = in_RDX, uVar4 = uc_init_engine(uc), uVar4 != UC_ERR_OK)) {
        return uVar4;
      }
      uVar7 = uc->cpu_model;
      goto LAB_004cdfdc;
    }
    if ((int)(uc_context_content)local_d8 < 0) {
      return UC_ERR_ARG;
    }
    if (uc->init_done != false) {
      return UC_ERR_ARG;
    }
    switch(uc->arch) {
    case UC_ARCH_ARM:
      if (0x21 < (uc_context_content)local_d8) {
        return UC_ERR_ARG;
      }
      if (((uc->mode & UC_MODE_BIG_ENDIAN) != UC_MODE_ARM) &&
         ((uc_context_content)local_d8 - 0xe < 4)) {
        return UC_ERR_ARG;
      }
      break;
    case UC_ARCH_ARM64:
      if (3 < (uc_context_content)local_d8) {
        return UC_ERR_ARG;
      }
      break;
    case UC_ARCH_MIPS:
      if ((0xf < (uc_context_content)local_d8 & (byte)((uc->mode & UC_MODE_32) >> 2)) != 0) {
        return UC_ERR_ARG;
      }
      bVar5 = (byte)((uc->mode & UC_MODE_64) >> 3);
      bVar11 = (uc_context_content)local_d8 < 0xd;
      goto LAB_004ce208;
    case UC_ARCH_X86:
    case UC_ARCH_S390X:
      if (0x25 < (uc_context_content)local_d8) {
        return UC_ERR_ARG;
      }
      break;
    case UC_ARCH_PPC:
      if ((0x121 < (uc_context_content)local_d8 & (byte)((uc->mode & UC_MODE_32) >> 2)) != 0) {
        return UC_ERR_ARG;
      }
      bVar5 = (byte)((uc->mode & UC_MODE_64) >> 3);
      bVar11 = (uc_context_content)local_d8 < 0x13;
      goto LAB_004ce208;
    case UC_ARCH_SPARC:
      if ((0xc < (uc_context_content)local_d8 & (byte)((uc->mode & UC_MODE_32) >> 2)) != 0) {
        return UC_ERR_ARG;
      }
      bVar5 = (byte)((uc->mode & UC_MODE_64) >> 3);
      bVar11 = (uc_context_content)local_d8 < 0x11;
LAB_004ce208:
      bVar11 = !bVar11;
LAB_004ce234:
      if ((bVar11 & bVar5) != 0) {
        return UC_ERR_ARG;
      }
      break;
    case UC_ARCH_M68K:
      if (8 < (uc_context_content)local_d8) {
        return UC_ERR_ARG;
      }
      break;
    case UC_ARCH_RISCV:
      if ((3 < (uc_context_content)local_d8 & (byte)((uc->mode & UC_MODE_32) >> 2)) != 0) {
        return UC_ERR_ARG;
      }
      bVar11 = 3 < (uc_context_content)local_d8;
      bVar5 = (byte)((uc->mode & UC_MODE_64) >> 3);
      goto LAB_004ce234;
    default:
      goto switchD_004cde68_default;
    }
    uc->cpu_model = (uc_context_content)local_d8;
    break;
  case UC_CTL_TB_REQUEST_CACHE:
    local_d8 = in_RDX;
    if ((uc->init_done == false) && (uVar4 = uc_init_engine(uc), uVar4 != UC_ERR_OK)) {
      return uVar4;
    }
    if (uVar8 != 3) {
      return UC_ERR_ARG;
    }
    uVar4 = (*uc->uc_gen_tb)(uc,(uint64_t)local_d8,local_d0);
    return uVar4;
  case UC_CTL_TB_REMOVE_CACHE:
    local_d8 = in_RDX;
    if ((uc->init_done == false) && (uVar4 = uc_init_engine(uc), uVar4 != UC_ERR_OK)) {
      return uVar4;
    }
    if (uVar8 != 1) {
      return UC_ERR_ARG;
    }
    if (local_d0 < local_d8 || (long)local_d0 - (long)local_d8 == 0) {
      return UC_ERR_ARG;
    }
    (*uc->uc_invalidate_tb)(uc,(uint64_t)local_d8,(long)local_d0 - (long)local_d8);
    break;
  case UC_CTL_TB_FLUSH:
    local_d8 = in_RDX;
    if ((uc->init_done == false) && (uVar4 = uc_init_engine(uc), uVar4 != UC_ERR_OK)) {
      return uVar4;
    }
    if (uVar8 != 1) {
      return UC_ERR_ARG;
    }
    (*uc->tb_flush)(uc);
    break;
  case UC_CTL_TLB_FLUSH:
    local_d8 = in_RDX;
    if ((uc->init_done == false) && (uVar4 = uc_init_engine(uc), uVar4 != UC_ERR_OK)) {
      return uVar4;
    }
    if (uVar8 != 1) {
      return UC_ERR_ARG;
    }
    (*uc->tcg_flush_tlb)(uc);
    break;
  case UC_CTL_TLB_TYPE:
    local_d8 = in_RDX;
    if ((uc->init_done == false) && (uVar4 = uc_init_engine(uc), uVar4 != UC_ERR_OK)) {
      return uVar4;
    }
    if (uVar8 != 1) {
      return UC_ERR_ARG;
    }
    uVar4 = (*uc->set_tlb)(uc,(uc_context_content)local_d8);
    return uVar4;
  case UC_CTL_TCG_BUFFER_SIZE:
    if (uVar8 != 1) {
      if ((uc->init_done == false) &&
         (local_d8 = in_RDX, uVar4 = uc_init_engine(uc), uVar4 != UC_ERR_OK)) {
        return uVar4;
      }
      uVar7 = uc->tcg_buffer_size;
      goto LAB_004cdfdc;
    }
    uc->tcg_buffer_size = (uc_context_content)local_d8;
    break;
  case UC_CTL_CONTEXT_MODE:
    if ((uc->init_done == false) &&
       (local_d8 = in_RDX, uVar4 = uc_init_engine(uc), uVar4 != UC_ERR_OK)) {
      return uVar4;
    }
    if (uVar8 != 1) {
      return UC_ERR_ARG;
    }
    uc->context_content = (uc_context_content)local_d8;
  }
  uVar4 = UC_ERR_OK;
switchD_004cde68_default:
  return uVar4;
}

Assistant:

UNICORN_EXPORT
uc_err uc_ctl(uc_engine *uc, uc_control_type control, ...)
{
    int rw, type;
    uc_err err = UC_ERR_OK;
    va_list args;

    // MSVC Would do signed shift on signed integers.
    rw = (uint32_t)control >> 30;
    type = (control & ((1 << 16) - 1));
    va_start(args, control);

    switch (type) {
    case UC_CTL_UC_MODE: {
        if (rw == UC_CTL_IO_READ) {
            int *pmode = va_arg(args, int *);
            *pmode = uc->mode;
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_UC_ARCH: {
        if (rw == UC_CTL_IO_READ) {
            int *arch = va_arg(args, int *);
            *arch = uc->arch;
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_UC_TIMEOUT: {
        if (rw == UC_CTL_IO_READ) {
            uint64_t *arch = va_arg(args, uint64_t *);
            *arch = uc->timeout;
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_UC_PAGE_SIZE: {
        if (rw == UC_CTL_IO_READ) {

            UC_INIT(uc);

            uint32_t *page_size = va_arg(args, uint32_t *);
            *page_size = uc->target_page_size;
        } else {
            uint32_t page_size = va_arg(args, uint32_t);
            int bits = 0;

            if (uc->init_done) {
                err = UC_ERR_ARG;
                break;
            }

            if (uc->arch != UC_ARCH_ARM) {
                err = UC_ERR_ARG;
                break;
            }

            if ((page_size & (page_size - 1))) {
                err = UC_ERR_ARG;
                break;
            }

            while (page_size) {
                bits++;
                page_size >>= 1;
            }

            uc->target_bits = bits;

            err = UC_ERR_OK;
        }
        break;
    }

    case UC_CTL_UC_USE_EXITS: {
        if (rw == UC_CTL_IO_WRITE) {
            int use_exits = va_arg(args, int);
            uc->use_exits = use_exits;
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_UC_EXITS_CNT: {

        UC_INIT(uc);

        if (!uc->use_exits) {
            err = UC_ERR_ARG;
        } else if (rw == UC_CTL_IO_READ) {
            size_t *exits_cnt = va_arg(args, size_t *);
            *exits_cnt = g_tree_nnodes(uc->ctl_exits);
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_UC_EXITS: {

        UC_INIT(uc);

        if (!uc->use_exits) {
            err = UC_ERR_ARG;
        } else if (rw == UC_CTL_IO_READ) {
            uint64_t *exits = va_arg(args, uint64_t *);
            size_t cnt = va_arg(args, size_t);
            if (cnt < g_tree_nnodes(uc->ctl_exits)) {
                err = UC_ERR_ARG;
            } else {
                uc_ctl_exit_request req;
                req.array = exits;
                req.len = 0;

                g_tree_foreach(uc->ctl_exits, uc_read_exit_iter, (void *)&req);
            }
        } else if (rw == UC_CTL_IO_WRITE) {
            uint64_t *exits = va_arg(args, uint64_t *);
            size_t cnt = va_arg(args, size_t);

            g_tree_remove_all(uc->ctl_exits);

            for (size_t i = 0; i < cnt; i++) {
                uc_add_exit(uc, exits[i]);
            }
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_CPU_MODEL: {
        if (rw == UC_CTL_IO_READ) {

            UC_INIT(uc);

            int *model = va_arg(args, int *);
            *model = uc->cpu_model;
        } else {
            int model = va_arg(args, int);

            if (model < 0 || uc->init_done) {
                err = UC_ERR_ARG;
                break;
            }

            if (uc->arch == UC_ARCH_X86) {
                if (model >= UC_CPU_X86_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_ARM) {
                if (model >= UC_CPU_ARM_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }

                if (uc->mode & UC_MODE_BIG_ENDIAN) {
                    // These cpu models don't support big endian code access.
                    if (model <= UC_CPU_ARM_CORTEX_A15 &&
                        model >= UC_CPU_ARM_CORTEX_A7) {
                        err = UC_ERR_ARG;
                        break;
                    }
                }
            } else if (uc->arch == UC_ARCH_ARM64) {
                if (model >= UC_CPU_ARM64_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_MIPS) {
                if (uc->mode & UC_MODE_32 && model >= UC_CPU_MIPS32_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }

                if (uc->mode & UC_MODE_64 && model >= UC_CPU_MIPS64_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_PPC) {
                // UC_MODE_PPC32 == UC_MODE_32
                if (uc->mode & UC_MODE_32 && model >= UC_CPU_PPC32_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }

                if (uc->mode & UC_MODE_64 && model >= UC_CPU_PPC64_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_RISCV) {
                if (uc->mode & UC_MODE_32 && model >= UC_CPU_RISCV32_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }

                if (uc->mode & UC_MODE_64 && model >= UC_CPU_RISCV64_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_S390X) {
                if (model >= UC_CPU_S390X_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_SPARC) {
                if (uc->mode & UC_MODE_32 && model >= UC_CPU_SPARC32_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
                if (uc->mode & UC_MODE_64 && model >= UC_CPU_SPARC64_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_M68K) {
                if (model >= UC_CPU_M68K_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else {
                err = UC_ERR_ARG;
                break;
            }

            uc->cpu_model = model;

            err = UC_ERR_OK;
        }
        break;
    }

    case UC_CTL_TB_REQUEST_CACHE: {

        UC_INIT(uc);

        if (rw == UC_CTL_IO_READ_WRITE) {
            uint64_t addr = va_arg(args, uint64_t);
            uc_tb *tb = va_arg(args, uc_tb *);
            err = uc->uc_gen_tb(uc, addr, tb);
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_TB_REMOVE_CACHE: {

        UC_INIT(uc);

        if (rw == UC_CTL_IO_WRITE) {
            uint64_t addr = va_arg(args, uint64_t);
            uint64_t end = va_arg(args, uint64_t);
            if (end <= addr) {
                err = UC_ERR_ARG;
            } else {
                uc->uc_invalidate_tb(uc, addr, end - addr);
            }
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_TB_FLUSH:

        UC_INIT(uc);

        if (rw == UC_CTL_IO_WRITE) {
            uc->tb_flush(uc);
        } else {
            err = UC_ERR_ARG;
        }
        break;

    case UC_CTL_TLB_FLUSH:

        UC_INIT(uc);

        if (rw == UC_CTL_IO_WRITE) {
            uc->tcg_flush_tlb(uc);
        } else {
            err = UC_ERR_ARG;
        }
        break;

    case UC_CTL_TLB_TYPE: {

        UC_INIT(uc);

        if (rw == UC_CTL_IO_WRITE) {
            int mode = va_arg(args, int);
            err = uc->set_tlb(uc, mode);
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_TCG_BUFFER_SIZE: {
        if (rw == UC_CTL_IO_WRITE) {
            uint32_t size = va_arg(args, uint32_t);
            uc->tcg_buffer_size = size;
        } else {

            UC_INIT(uc);

            uint32_t *size = va_arg(args, uint32_t *);
            *size = uc->tcg_buffer_size;
        }
        break;
    }

    case UC_CTL_CONTEXT_MODE:

        UC_INIT(uc);

        if (rw == UC_CTL_IO_WRITE) {
            int mode = va_arg(args, int);
            uc->context_content = mode;
            err = UC_ERR_OK;
        } else {
            err = UC_ERR_ARG;
        }
        break;

    default:
        err = UC_ERR_ARG;
        break;
    }

    va_end(args);

    return err;
}